

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_sort_helper(secp256k1_pubkey *pk,size_t *pk_order,size_t n_pk)

{
  uchar uVar1;
  int iVar2;
  size_t sVar3;
  uchar *p1;
  secp256k1_scalar *message;
  long lVar4;
  secp256k1_scalar *seckey;
  secp256k1_scalar *sigs;
  secp256k1_context *sigr;
  int *in_R8;
  secp256k1_pubkey *pk_test [5];
  secp256k1_scalar sStack_88;
  size_t sStack_68;
  secp256k1_scalar local_38;
  
  sigs = &local_38;
  if (n_pk == 0) {
    secp256k1_ec_pubkey_sort(CTX,(secp256k1_pubkey **)&local_38,0);
  }
  else {
    sVar3 = 0;
    do {
      local_38.d[sVar3] = (uint64_t)(pk + pk_order[sVar3]);
      sVar3 = sVar3 + 1;
    } while (n_pk != sVar3);
    sigr = CTX;
    secp256k1_ec_pubkey_sort(CTX,(secp256k1_pubkey **)&local_38,n_pk);
    sVar3 = 0;
    do {
      message = (secp256k1_scalar *)local_38.d[sVar3];
      lVar4 = 0;
      do {
        uVar1 = *(uchar *)((long)message->d + lVar4);
        sigs = (secp256k1_scalar *)CONCAT71((int7)((ulong)sigs >> 8),uVar1);
        if (uVar1 != pk->data[lVar4]) {
          test_sort_helper_cold_1();
          sStack_68 = n_pk;
          do {
            testutil_random_scalar_order_test(&sStack_88);
            iVar2 = secp256k1_ecdsa_sig_sign
                              (&CTX->ecmult_gen_ctx,(secp256k1_scalar *)sigr,sigs,seckey,message,
                               &sStack_88,in_R8);
          } while (iVar2 == 0);
          return;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x40);
      sVar3 = sVar3 + 1;
      pk = pk + 1;
    } while (sVar3 != n_pk);
  }
  return;
}

Assistant:

static void test_sort_helper(secp256k1_pubkey *pk, size_t *pk_order, size_t n_pk) {
    size_t i;
    const secp256k1_pubkey *pk_test[5];

    for (i = 0; i < n_pk; i++) {
        pk_test[i] = &pk[pk_order[i]];
    }
    secp256k1_ec_pubkey_sort(CTX, pk_test, n_pk);
    for (i = 0; i < n_pk; i++) {
        CHECK(secp256k1_memcmp_var(pk_test[i], &pk[i], sizeof(*pk_test[i])) == 0);
    }
}